

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_set.h
# Opt level: O2

void __thiscall duckdb_re2::SparseSetT<void>::SparseSetT(SparseSetT<void> *this,int max_size)

{
  this->size_ = 0;
  PODArray<int>::PODArray(&this->sparse_,max_size);
  PODArray<int>::PODArray(&this->dense_,max_size);
  MaybeInitializeMemory(this,this->size_,max_size);
  return;
}

Assistant:

SparseSetT<Value>::SparseSetT(int max_size) :
    sparse_(max_size), dense_(max_size) {
  MaybeInitializeMemory(size_, max_size);
  DebugCheckInvariants();
}